

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::AlterType
          (RowGroup *this,RowGroupCollection *new_collection,LogicalType *target_type,
          idx_t changed_idx,ExpressionExecutor *executor,CollectionScanState *scan_state,
          DataChunk *scan_chunk)

{
  BlockManager *block_manager;
  DataTableInfo *info;
  ColumnData *pCVar1;
  Allocator *allocator;
  reference result;
  pointer pRVar2;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_00;
  reference __x;
  idx_t i;
  ExpressionExecutor *__n;
  DataChunk *in_stack_00000010;
  shared_ptr<duckdb::ColumnData,_true> column_data;
  shared_ptr<duckdb::RowVersionManager,_true> local_c8;
  vector<duckdb::LogicalType,_true> append_types;
  ColumnAppendState append_state;
  DataChunk append_chunk;
  
  block_manager =
       (BlockManager *)
       ((new_collection->info).internal.
        super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
       _vptr__Sp_counted_base;
  info = GetTableInfo((RowGroup *)new_collection);
  ColumnData::CreateColumn
            ((ColumnData *)&column_data,block_manager,info,(idx_t)executor,
             (idx_t)new_collection->block_manager,(LogicalType *)changed_idx,
             (optional_ptr<duckdb::ColumnData,_true>)0x0);
  append_state.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  append_state.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  append_state.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  append_state.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  append_state.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  pCVar1 = shared_ptr<duckdb::ColumnData,_true>::operator->(&column_data);
  (*pCVar1->_vptr_ColumnData[0x11])(pCVar1,&append_state);
  CollectionScanState::Initialize
            ((CollectionScanState *)scan_chunk,
             (vector<duckdb::LogicalType,_true> *)
             &(new_collection->info).internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[2]._M_use_count);
  InitializeScan((RowGroup *)new_collection,(CollectionScanState *)scan_chunk);
  DataChunk::DataChunk(&append_chunk);
  append_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  append_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  append_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&append_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (value_type *)changed_idx);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&append_chunk,allocator,&append_types,0x800);
  result = vector<duckdb::Vector,_true>::get<true>(&append_chunk.data,0);
  while( true ) {
    DataChunk::Reset(in_stack_00000010);
    ScanCommitted((RowGroup *)new_collection,(CollectionScanState *)scan_chunk,in_stack_00000010,
                  TABLE_SCAN_COMMITTED_ROWS);
    if (in_stack_00000010->count == 0) break;
    DataChunk::Reset(&append_chunk);
    ExpressionExecutor::ExecuteExpression((ExpressionExecutor *)scan_state,in_stack_00000010,result)
    ;
    pCVar1 = shared_ptr<duckdb::ColumnData,_true>::operator->(&column_data);
    ColumnData::Append(pCVar1,&append_state,result,in_stack_00000010->count);
  }
  make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,std::atomic<unsigned_long>&>
            ((duckdb *)this,(RowGroupCollection *)target_type,(unsigned_long *)new_collection,
             (atomic<unsigned_long> *)&new_collection->row_group_size);
  pRVar2 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this);
  GetOrCreateVersionInfoPtr((RowGroup *)&local_c8);
  SetVersionInfo(pRVar2,&local_c8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.internal.
              super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  this_00 = GetColumns((RowGroup *)new_collection);
  for (__n = (ExpressionExecutor *)0x0;
      __n < (ExpressionExecutor *)
            ((long)(this_00->
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ).
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ).
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
      __n = (ExpressionExecutor *)
            ((long)&(__n->expressions).
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1)) {
    if (executor == __n) {
      pRVar2 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)this);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
                ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
                  *)&pRVar2->columns,&column_data);
      ::std::__shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2> *)&column_data);
    }
    else {
      pRVar2 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)this);
      __x = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>
                      (this_00,(size_type)__n);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ::push_back(&(pRVar2->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ,__x);
    }
  }
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&append_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  DataChunk::~DataChunk(&append_chunk);
  ColumnAppendState::~ColumnAppendState(&append_state);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&column_data.internal.
              super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroup::AlterType(RowGroupCollection &new_collection, const LogicalType &target_type,
                                         idx_t changed_idx, ExpressionExecutor &executor,
                                         CollectionScanState &scan_state, DataChunk &scan_chunk) {
	Verify();

	// construct a new column data for this type
	auto column_data = ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), changed_idx, start, target_type);

	ColumnAppendState append_state;
	column_data->InitializeAppend(append_state);

	// scan the original table, and fill the new column with the transformed value
	scan_state.Initialize(GetCollection().GetTypes());
	InitializeScan(scan_state);

	DataChunk append_chunk;
	vector<LogicalType> append_types;
	append_types.push_back(target_type);
	append_chunk.Initialize(Allocator::DefaultAllocator(), append_types);
	auto &append_vector = append_chunk.data[0];
	while (true) {
		// scan the table
		scan_chunk.Reset();
		ScanCommitted(scan_state, scan_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
		if (scan_chunk.size() == 0) {
			break;
		}
		// execute the expression
		append_chunk.Reset();
		executor.ExecuteExpression(scan_chunk, append_vector);
		column_data->Append(append_state, append_vector, scan_chunk.size());
	}

	// set up the row_group based on this row_group
	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	auto &cols = GetColumns();
	for (idx_t i = 0; i < cols.size(); i++) {
		if (i == changed_idx) {
			// this is the altered column: use the new column
			row_group->columns.push_back(std::move(column_data));
			column_data.reset();
		} else {
			// this column was not altered: use the data directly
			row_group->columns.push_back(cols[i]);
		}
	}
	row_group->Verify();
	return row_group;
}